

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmChk<(moira::Instr)35,(moira::Mode)10,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  char *pcVar5;
  StrWriter *pSVar6;
  long lVar7;
  Ea<(moira::Mode)10,_(moira::Size)2> src;
  Ea<(moira::Mode)10,_(moira::Size)2> local_2c;
  
  Op<(moira::Mode)10,(moira::Size)2>(&local_2c,this,op & 7,addr);
  pcVar5 = "chk";
  if (str->upper != false) {
    pcVar5 = "CHK";
  }
  cVar4 = *pcVar5;
  while (cVar4 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar5;
  }
  if (str->upper == false) {
    cVar4 = '.';
    lVar7 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = ".w"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  else {
    cVar4 = '.';
    lVar7 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = ".W"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pSVar6 = StrWriter::operator<<(str,&local_2c);
  cVar4 = ',';
  lVar7 = 0;
  do {
    pcVar5 = pSVar6->ptr;
    pSVar6->ptr = pcVar5 + 1;
    *pcVar5 = cVar4;
    cVar4 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  pcVar5 = pSVar6->ptr;
  pSVar6->ptr = pcVar5 + 1;
  *pcVar5 = 'D';
  pbVar3 = (byte *)pSVar6->ptr;
  pSVar6->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmChk(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}